

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

list_entry_t __thiscall
duckdb::ListSliceOperations::SliceValueWithSteps
          (ListSliceOperations *this,Vector *result,SelectionVector *sel,list_entry_t input,
          int64_t begin,int64_t end,int64_t step,idx_t *sel_idx)

{
  long lVar1;
  long lVar2;
  idx_t iVar3;
  uint64_t uVar4;
  int iVar5;
  idx_t iVar6;
  list_entry_t lVar7;
  
  if (begin == input.length) {
    uVar4 = *(uint64_t *)step;
    iVar3 = 0;
  }
  else {
    iVar3 = CalculateSliceLength<long>(input.length,begin,end,true);
    uVar4 = *(uint64_t *)step;
    if (iVar3 != 0) {
      lVar1 = *(long *)step;
      iVar5 = (int)sel + -1 + (int)begin;
      if (-1 < end) {
        iVar5 = (int)input.length + (int)sel;
      }
      lVar2 = *(long *)result;
      iVar6 = 0;
      do {
        *(int *)(lVar1 * 4 + lVar2 + iVar6 * 4) = iVar5;
        iVar6 = iVar6 + 1;
        iVar5 = iVar5 + (int)end;
      } while (iVar3 != iVar6);
      *(idx_t *)step = lVar1 + iVar6;
    }
  }
  lVar7.length = iVar3;
  lVar7.offset = uVar4;
  return lVar7;
}

Assistant:

static list_entry_t SliceValueWithSteps(Vector &result, SelectionVector &sel, list_entry_t input, int64_t begin,
	                                        int64_t end, int64_t step, idx_t &sel_idx) {
		if (end - begin == 0) {
			input.length = 0;
			input.offset = sel_idx;
			return input;
		}
		input.length = CalculateSliceLength(UnsafeNumericCast<idx_t>(begin), UnsafeNumericCast<idx_t>(end), step, true);
		idx_t child_idx = input.offset + UnsafeNumericCast<idx_t>(begin);
		if (step < 0) {
			child_idx = input.offset + UnsafeNumericCast<idx_t>(end) - 1;
		}
		input.offset = sel_idx;
		for (idx_t i = 0; i < input.length; i++) {
			sel.set_index(sel_idx, child_idx);
			child_idx += static_cast<idx_t>(step); // intentional overflow??
			sel_idx++;
		}
		return input;
	}